

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * CompileVmTypeCast(ExpressionContext *ctx,VmModule *module,ExprTypeCast *node)

{
  VmValueType VVar1;
  uint uVar2;
  _func_int **pp_Var3;
  undefined1 auVar4 [16];
  VmValueType VVar5;
  VmInstruction *address;
  TypeRef *pTVar6;
  VmConstant *pVVar7;
  VmInstruction *pVVar8;
  VmInstruction *el1;
  SynBase *pSVar9;
  VmModule *pVVar10;
  TypeBase *type;
  uint uVar11;
  TypeBase *pTVar12;
  uint in_R9D;
  VmType type_00;
  VmType type_01;
  VmType type_02;
  VmType VVar13;
  uint in_stack_ffffffffffffff98;
  VmValue *in_stack_ffffffffffffffa0;
  VmValue *in_stack_ffffffffffffffb8;
  
  address = (VmInstruction *)CompileVm(ctx,module,node->value);
  switch(node->category) {
  case EXPR_CAST_NUMERICAL:
    pTVar12 = (node->super_ExprBase).type;
    if (pTVar12 == ctx->typeBool) {
      VVar1 = (address->super_VmValue).type.type;
      uVar2 = (address->super_VmValue).type.size;
      if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
        pSVar9 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantInt(module->allocator,pSVar9,0);
      }
      else if (uVar2 == 8 && VVar1 == VM_TYPE_DOUBLE) {
        pSVar9 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantDouble(module->allocator,pSVar9,0.0);
      }
      else {
        if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0xa95,
                        "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)"
                       );
        }
        pSVar9 = (node->super_ExprBase).source;
        pVVar7 = CreateConstantLong(module->allocator,pSVar9,0);
      }
      goto LAB_00273314;
    }
    pVVar10 = (VmModule *)(node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,pTVar12);
    VVar1 = (address->super_VmValue).type.type;
    uVar2 = (address->super_VmValue).type.size;
    VVar5 = VVar13.type;
    uVar11 = VVar13.size;
    if ((VVar1 != VVar5) || (uVar2 != uVar11)) {
      if (uVar11 == 4 && VVar5 == VM_TYPE_INT) {
        if (uVar2 == 8 && VVar1 == VM_TYPE_DOUBLE) {
          pSVar9 = (SynBase *)0x400000001;
          pTVar12 = (TypeBase *)0xf;
        }
        else {
          if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) goto LAB_002738b7;
          pSVar9 = (SynBase *)0x400000001;
          pTVar12 = (TypeBase *)0x15;
        }
      }
      else if (uVar11 == 8 && VVar5 == VM_TYPE_DOUBLE) {
        if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
          pSVar9 = (SynBase *)0x800000002;
          pTVar12 = (TypeBase *)0x12;
        }
        else {
          if ((VVar1 != VM_TYPE_LONG) || (uVar2 != 8)) goto LAB_002738b7;
          pSVar9 = (SynBase *)0x800000002;
          pTVar12 = (TypeBase *)0x13;
        }
      }
      else {
        if ((VVar5 != VM_TYPE_LONG) || (uVar11 != 8)) {
LAB_002738b7:
          __assert_fail("!\"unknown cast\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                        ,0x206,
                        "VmValue *(anonymous namespace)::CreateCast(VmModule *, SynBase *, VmValue *, VmType)"
                       );
        }
        if (uVar2 == 4 && VVar1 == VM_TYPE_INT) {
          pSVar9 = (SynBase *)0x800000003;
          pTVar12 = (TypeBase *)0x14;
        }
        else {
          if ((VVar1 != VM_TYPE_DOUBLE) || (uVar2 != 8)) goto LAB_002738b7;
          pSVar9 = (SynBase *)0x800000003;
          pTVar12 = (TypeBase *)0x10;
        }
      }
      type_02.structType = pTVar12;
      type_02._0_8_ = VVar13.structType;
      address = anon_unknown.dwarf_22bf96::CreateInstruction
                          ((anon_unknown_dwarf_22bf96 *)module,pVVar10,pSVar9,type_02,
                           (VmInstructionType)address,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                           (VmValue *)0x0,in_stack_ffffffffffffffb8);
    }
    break;
  case EXPR_CAST_PTR_TO_BOOL:
switchD_00273040_caseD_1:
    pSVar9 = (node->super_ExprBase).source;
    pVVar7 = CreateConstantPointer
                       (module->allocator,pSVar9,0,(VariableData *)0x0,ctx->typeNullPtr,false);
LAB_00273314:
    address = (VmInstruction *)
              anon_unknown.dwarf_22bf96::CreateCompareNotEqual
                        (module,pSVar9,&address->super_VmValue,&pVVar7->super_VmValue);
    goto LAB_002735c0;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    pTVar12 = node->value->type;
    if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x14)) {
      pVVar10 = (VmModule *)(node->super_ExprBase).source;
      pTVar6 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar12[1].typeIndex);
      if (pTVar6 == (TypeRef *)0x0) {
LAB_0027385a:
        __assert_fail("structType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                      ,0xcd,"static const VmType VmType::Pointer(TypeBase *)");
      }
      type_00.structType = (TypeBase *)address;
      type_00._0_8_ = pTVar6;
      address = (VmInstruction *)
                anon_unknown.dwarf_22bf96::CreateExtract
                          ((anon_unknown_dwarf_22bf96 *)module,pVVar10,(SynBase *)0x800000006,
                           type_00,(VmValue *)0x0,in_stack_ffffffffffffff98);
      goto switchD_00273040_caseD_1;
    }
    break;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    auVar4._8_8_ = 0;
    auVar4._0_8_ = address;
    pVVar8 = (VmInstruction *)
             anon_unknown.dwarf_22bf96::CreateExtract
                       ((anon_unknown_dwarf_22bf96 *)module,
                        (VmModule *)(node->super_ExprBase).source,(SynBase *)0x400000001,
                        (VmType)(auVar4 << 0x40),(VmValue *)0x8,in_stack_ffffffffffffff98);
    if (pVVar8 != (VmInstruction *)0x0) {
      pSVar9 = (node->super_ExprBase).source;
      pVVar7 = CreateConstantInt(module->allocator,pSVar9,0);
      address = pVVar8;
      goto LAB_00273314;
    }
    break;
  case EXPR_CAST_NULL_TO_PTR:
    address = (VmInstruction *)
              CreateConstantPointer
                        (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                         (node->super_ExprBase).type,false);
    goto LAB_002735c0;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pSVar9 = (node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar8 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    el1 = (VmInstruction *)
          CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    goto LAB_00273454;
  case EXPR_CAST_NULL_TO_UNSIZED:
  case EXPR_CAST_NULL_TO_FUNCTION:
    pSVar9 = (node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar8 = (VmInstruction *)
             CreateConstantPointer
                       (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                        ctx->typeNullPtr,false);
    el1 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
LAB_00273454:
    pVVar7 = (VmConstant *)0x0;
LAB_002735bb:
    address = (VmInstruction *)
              anon_unknown.dwarf_22bf96::CreateConstruct
                        (module,pSVar9,VVar13,&pVVar8->super_VmValue,&el1->super_VmValue,
                         &pVVar7->super_VmValue,in_stack_ffffffffffffffa0);
LAB_002735c0:
    type = (node->super_ExprBase).type;
    goto LAB_00273824;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pSVar9 = (node->super_ExprBase).source;
    VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
    pVVar8 = (VmInstruction *)CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    el1 = (VmInstruction *)
          CreateConstantPointer
                    (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                     ctx->typeNullPtr,false);
    pVVar7 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
    goto LAB_002735bb;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar12 = node->value->type;
    if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x12)) {
      pp_Var3 = pTVar12[1]._vptr_TypeBase;
      if ((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x13)) {
        __assert_fail("arrType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xaba,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      if (*(int *)((long)pp_Var3 + 0x6c) != 0) {
        __assert_fail("unsigned(arrType->length) == arrType->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0xabb,
                      "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)")
        ;
      }
      pSVar9 = (node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
      el1 = (VmInstruction *)
            CreateConstantInt(module->allocator,(node->super_ExprBase).source,
                              *(int *)(pp_Var3 + 0xd));
      pVVar8 = address;
      goto LAB_00273454;
    }
    break;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar12 = node->value->type;
    if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x12)) {
      pp_Var3 = pTVar12[1]._vptr_TypeBase;
      if (((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x18)) ||
         ((*(char *)(pp_Var3 + 0x22) == '\0' && (pp_Var3[0x23] == (_func_int *)0x0)))) {
        pVVar8 = (VmInstruction *)
                 anon_unknown.dwarf_22bf96::CreateTypeIndex
                           (module,(node->super_ExprBase).source,
                            (TypeBase *)(ulong)*(uint *)(pp_Var3 + 5));
      }
      else {
        pVVar8 = (VmInstruction *)
                 anon_unknown.dwarf_22bf96::CreateLoad
                           (ctx,module,(node->super_ExprBase).source,ctx->typeTypeID,
                            (VmValue *)address,in_R9D);
      }
      pSVar9 = (node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
LAB_002735b8:
      pVVar7 = (VmConstant *)0x0;
      el1 = address;
      goto LAB_002735bb;
    }
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar12 = (node->super_ExprBase).type;
    if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x12)) {
      pVVar10 = (VmModule *)(node->super_ExprBase).source;
      pTVar12 = (TypeBase *)pTVar12[1]._vptr_TypeBase;
      pTVar6 = ExpressionContext::GetReferenceType(ctx,pTVar12);
      if (pTVar6 == (TypeRef *)0x0) goto LAB_0027385a;
      pVVar7 = CreateConstantInt(module->allocator,(SynBase *)pVVar10,pTVar12->typeIndex);
      VVar13.structType = &pTVar6->super_TypeBase;
      VVar13.type = VM_TYPE_POINTER;
      VVar13.size = 8;
      pTVar12 = (TypeBase *)0x47;
LAB_002736e8:
      type_01._0_8_ = VVar13.structType;
      type_01.structType = pTVar12;
      address = anon_unknown.dwarf_22bf96::CreateInstruction
                          ((anon_unknown_dwarf_22bf96 *)module,pVVar10,VVar13._0_8_,type_01,
                           (VmInstructionType)address,&pVVar7->super_VmValue,(VmValue *)0x0,
                           (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffffb8);
      goto LAB_002735c0;
    }
    break;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar12 = node->value->type;
    if ((pTVar12 != (TypeBase *)0x0) && (pTVar12->typeID == 0x14)) {
      pSVar9 = (node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,(node->super_ExprBase).type);
      pVVar8 = (VmInstruction *)
               anon_unknown.dwarf_22bf96::CreateTypeIndex
                         (module,(node->super_ExprBase).source,
                          (TypeBase *)(ulong)*(uint *)(*(long *)&pTVar12[1].typeIndex + 0x28));
      goto LAB_002735b8;
    }
    break;
  case EXPR_CAST_REINTERPRET:
    type = (node->super_ExprBase).type;
    pTVar12 = node->value->type;
    if ((type == pTVar12) || (type == (TypeBase *)0x0)) goto LAB_00273824;
    uVar2 = type->typeID;
    if (uVar2 == 0x14) {
      if ((pTVar12 == (TypeBase *)0x0) || (pTVar12->typeID != 0x14)) goto LAB_00273824;
    }
    else if (pTVar12 == (TypeBase *)0x0 || uVar2 != 0x12) {
      if ((pTVar12 == (TypeBase *)0x0 || uVar2 != 0x15) || (pTVar12->typeID != 0x15))
      goto LAB_00273824;
    }
    else if (pTVar12->typeID != 0x12) goto LAB_00273824;
    if (((address == (VmInstruction *)0x0) || ((address->super_VmValue).typeID != 2)) ||
       (address->cmd != VM_INST_CALL)) {
      pVVar10 = (VmModule *)(node->super_ExprBase).source;
      VVar13 = GetVmType(ctx,type);
      pVVar7 = (VmConstant *)0x0;
      pTVar12 = (TypeBase *)0x4e;
      goto LAB_002736e8;
    }
    VVar13 = GetVmType(ctx,type);
    (address->super_VmValue).type = VVar13;
    break;
  default:
    __assert_fail("!\"unknown cast\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xb12,
                  "VmValue *CompileVmTypeCast(ExpressionContext &, VmModule *, ExprTypeCast *)");
  }
  type = (node->super_ExprBase).type;
LAB_00273824:
  anon_unknown.dwarf_22bf96::CheckType(ctx,(ExprBase *)type,&address->super_VmValue);
  return &address->super_VmValue;
}

Assistant:

VmValue* CompileVmTypeCast(ExpressionContext &ctx, VmModule *module, ExprTypeCast *node)
{
	VmValue *value = CompileVm(ctx, module, node->value);

	switch(node->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(node->type == ctx.typeBool)
		{
			if(value->type == VmType::Int)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantInt(module->allocator, node->source, 0)));

			if(value->type == VmType::Double)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantDouble(module->allocator, node->source, 0.0)));

			if(value->type == VmType::Long)
				return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantLong(module->allocator, node->source, 0ll)));

			assert(!"unknown type");
		}

		return CheckType(ctx, node, CreateCast(module, node->source, value, GetVmType(ctx, node->type)));
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, value, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		if(TypeUnsizedArray *unsizedArrType = getType<TypeUnsizedArray>(node->value->type))
		{
			VmValue *ptr = CreateExtract(module, node->source, VmType::Pointer(ctx.GetReferenceType(unsizedArrType->subType)), value, 0);

			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, ptr, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false)));
		}
		
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		if(VmValue *index = CreateExtract(module, node->source, VmType::Int, value, sizeof(void*)))
		{
			return CheckType(ctx, node, CreateCompareNotEqual(module, node->source, index, CreateConstantInt(module->allocator, node->source, 0)));
		}

		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(ctx, node, CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL));
	case EXPR_CAST_NULL_TO_UNSIZED:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL));
	case EXPR_CAST_NULL_TO_FUNCTION:
		return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL));
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), value, CreateConstantInt(module->allocator, node->source, unsigned(arrType->length)), NULL, NULL));
		}

		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->value->type))
		{
			TypeClass *classType = getType<TypeClass>(refType->subType);

			VmValue *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
				typeId = CreateLoad(ctx, module, node->source, ctx.typeTypeID, value, 0);
			else
				typeId = CreateTypeIndex(module, node->source, refType->subType);

			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), typeId, value, NULL, NULL));
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		if(TypeRef *refType = getType<TypeRef>(node->type))
		{
			return CheckType(ctx, node, CreateConvertPtr(module, node->source, value, refType->subType, ctx.GetReferenceType(refType->subType)));
		}

		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		if(TypeUnsizedArray *unsizedType = getType<TypeUnsizedArray>(node->value->type))
		{
			return CheckType(ctx, node, CreateConstruct(module, node->source, GetVmType(ctx, node->type), CreateTypeIndex(module, node->source, unsizedType->subType), value, NULL, NULL));
		}

		break;
	case EXPR_CAST_REINTERPRET:
		if(node->type == node->value->type)
			return CheckType(ctx, node, value);

		if(isType<TypeUnsizedArray>(node->type) && isType<TypeUnsizedArray>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeRef>(node->type) && isType<TypeRef>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}
		else if(isType<TypeFunction>(node->type) && isType<TypeFunction>(node->value->type))
		{
			// Try changing the target call type
			if(VmInstruction *inst = getType<VmInstruction>(value))
			{
				if(inst->cmd == VM_INST_CALL)
				{
					inst->type = GetVmType(ctx, node->type);

					return CheckType(ctx, node, value);
				}
			}

			return CheckType(ctx, node, CreateBitcast(module, node->source, GetVmType(ctx, node->type), value));
		}

		return CheckType(ctx, node, value);
	default:
		assert(!"unknown cast");
	}

	return CheckType(ctx, node, value);
}